

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

_Bool bitset_container_select
                (bitset_container_t *container,uint32_t *start_rank,uint32_t rank,uint32_t *element)

{
  uint32_t uVar1;
  uint64_t *puVar2;
  long lVar3;
  uint uVar4;
  int i;
  long lVar5;
  ulong uVar6;
  uint64_t w;
  ulong uVar7;
  uint uVar8;
  
  uVar4 = *start_rank + container->cardinality;
  if (rank < uVar4) {
    puVar2 = container->words;
    lVar5 = 0;
    do {
      uVar7 = puVar2[lVar5];
      uVar6 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
      uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
      uVar8 = (uint)(byte)(((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
              *start_rank;
      if (uVar8 < rank) {
        *start_rank = uVar8;
      }
      else {
        while (uVar7 != 0) {
          uVar1 = *start_rank;
          if (uVar1 == rank) {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            *element = (uint)lVar3 | (int)lVar5 << 6;
          }
          else {
            uVar7 = uVar7 & uVar7 - 1;
            *start_rank = uVar1 + 1;
          }
          if (uVar1 == rank) goto LAB_00118a7c;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x400);
  }
  else {
    *start_rank = uVar4;
  }
LAB_00118a7c:
  return rank < uVar4;
}

Assistant:

bool bitset_container_select(const bitset_container_t *container, uint32_t *start_rank, uint32_t rank, uint32_t *element) {
    int card = bitset_container_cardinality(container);
    if(rank >= *start_rank + card) {
        *start_rank += card;
        return false;
    }
    const uint64_t *words = container->words;
    int32_t size;
    for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; i += 1) {
        size = roaring_hamming(words[i]);
        if(rank <= *start_rank + size) {
            uint64_t w = container->words[i];
            uint16_t base = i*64;
            while (w != 0) {
                uint64_t t = w & (~w + 1);
                int r = roaring_trailing_zeroes(w);
                if(*start_rank == rank) {
                    *element = r+base;
                    return true;
                }
                w ^= t;
                *start_rank += 1;
            }
        }
        else
            *start_rank += size;
    }
    assert(false);
    roaring_unreachable;
}